

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

bool __thiscall
QToolBarAreaLayout::restoreState
          (QToolBarAreaLayout *this,QDataStream *stream,QList<QToolBar_*> *_toolBars,uchar tmarker,
          bool testing)

{
  QToolBarAreaLayoutInfo *this_00;
  int *piVar1;
  uint uVar2;
  char cVar3;
  QWidget *widget;
  QWidgetItemV2 *this_01;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Orientation orientation;
  ulong i;
  long in_FS_OFFSET;
  bool bVar8;
  QStringView QVar9;
  QStringView QVar10;
  uchar shown;
  int cnt;
  int pos;
  int lines;
  uint local_110;
  undefined4 uStack_10c;
  storage_type_conflict *local_108;
  long local_100;
  QRect local_f8;
  byte local_d9;
  QArrayData *local_d8;
  storage_type_conflict *psStack_d0;
  long local_c8;
  QToolBarAreaLayoutLine local_b8;
  int local_84;
  uint local_80;
  int local_7c;
  QList<QToolBar_*> local_78;
  QToolBarAreaLayoutItem local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (_toolBars->d).d;
  local_78.d.ptr = (_toolBars->d).ptr;
  local_78.d.size = (_toolBars->d).size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_7c = -0x55555556;
  QDataStream::operator>>(stream,&local_7c);
  if (0 < local_7c) {
    iVar5 = 0;
    do {
      local_80 = 0xaaaaaaaa;
      QDataStream::operator>>(stream,(int *)&local_80);
      if (3 < local_80) {
        bVar8 = false;
        goto LAB_004baf2c;
      }
      local_84 = -0x55555556;
      QDataStream::operator>>(stream,&local_84);
      this_00 = this->docks + (int)local_80;
      local_b8.rect.x1.m_i = 0;
      local_b8.rect.y1.m_i = 0;
      local_b8.rect.x2.m_i = -1;
      local_b8.rect.y2.m_i = -1;
      local_b8._20_4_ = 0xaaaaaaaa;
      local_b8.o = this->docks[(int)local_80].o;
      local_b8.toolBarItems.d.d = (Data *)0x0;
      local_b8.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
      local_b8.toolBarItems.d.size = 0;
      if (0 < local_84) {
        iVar4 = 0;
        do {
          local_58.widgetItem = (QLayoutItem *)0x0;
          local_58.pos = 0;
          local_58.size = -1;
          local_58.preferredSize = -1;
          local_58.gap = false;
          local_58._21_3_ = 0xaaaaaa;
          local_d8 = (QArrayData *)0x0;
          psStack_d0 = (storage_type_conflict *)0x0;
          local_c8 = 0;
          ::operator>>(stream,(QString *)&local_d8);
          local_d9 = 0xaa;
          QDataStream::operator>>(stream,&local_d9);
          local_110 = 0xaaaaaaaa;
          QDataStream::operator>>(stream,(int *)&local_110);
          local_58.pos = local_110;
          local_110 = 0xaaaaaaaa;
          QDataStream::operator>>(stream,(int *)&local_110);
          local_58.size = local_110;
          local_f8.x1.m_i = 0;
          local_f8.y1.m_i = 0;
          local_f8.x2.m_i = -1;
          local_f8.y2.m_i = -1;
          local_110 = 0xaaaaaaaa;
          QDataStream::operator>>(stream,(int *)&local_110);
          uVar2 = local_110;
          uVar6 = 0;
          if (tmarker == 0xfc) {
            local_110 = 0xaaaaaaaa;
            QDataStream::operator>>(stream,(int *)&local_110);
            uVar6 = uVar2;
            if ((uVar2 & 1) == 0) {
              local_f8.x2.m_i = -1;
              local_f8.y2.m_i = -1;
              local_f8.x1.m_i = 0;
              local_f8.y1.m_i = 0;
            }
            else {
              uVar7 = uVar2 >> 1 & 0xffff;
              local_f8.x2.m_i = ((uVar2 >> 0x11) - 0x8000) + uVar7;
              local_f8.y1.m_i = (local_110 & 0xffff) - 0x7fff;
              local_f8.x1.m_i = uVar7 - 0x7fff;
              local_f8.y2.m_i = (local_110 >> 0x10) + (local_110 & 0xffff) + -0x8000;
            }
          }
          if (local_78.d.size != 0) {
            i = 0;
            do {
              QObject::objectName();
              if (local_100 == local_c8) {
                QVar9.m_data = local_108;
                QVar9.m_size = local_100;
                QVar10.m_data = psStack_d0;
                QVar10.m_size = local_c8;
                cVar3 = QtPrivate::equalStrings(QVar9,QVar10);
              }
              else {
                cVar3 = '\0';
              }
              piVar1 = (int *)CONCAT44(uStack_10c,local_110);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  QArrayData::deallocate((QArrayData *)CONCAT44(uStack_10c,local_110),2,0x10);
                }
              }
              if (cVar3 != '\0') {
                widget = &QList<QToolBar_*>::takeAt(&local_78,i)->super_QWidget;
                goto LAB_004badc4;
              }
              i = i + 1;
            } while (i < (ulong)local_78.d.size);
          }
          widget = (QWidget *)0x0;
LAB_004badc4:
          if (widget != (QWidget *)0x0 && !testing) {
            *(undefined8 *)(*(long *)&widget->field_0x8 + 0xb0) = 0;
            this_01 = (QWidgetItemV2 *)operator_new(0x58);
            QWidgetItemV2::QWidgetItemV2(this_01,widget);
            if ((uVar6 & 1) == 0) {
              orientation = this_00->o;
            }
            else {
              orientation = Vertical - ((local_d9 & 2) == 0);
            }
            local_58.widgetItem = (QLayoutItem *)this_01;
            QToolBar::setOrientation((QToolBar *)widget,orientation);
            (**(code **)(*(long *)widget + 0x68))(widget,local_d9 & 1);
            QToolBarPrivate::setWindowState
                      (*(QToolBarPrivate **)&widget->field_0x8,(bool)((byte)uVar6 & 1),false,
                       &local_f8);
            local_58.preferredSize = local_58.size;
            QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
                      ((QPodArrayOps<QToolBarAreaLayoutItem> *)&local_b8.toolBarItems,
                       local_b8.toolBarItems.d.size,&local_58);
            QList<QToolBarAreaLayoutItem>::end(&local_b8.toolBarItems);
          }
          if (local_d8 != (QArrayData *)0x0) {
            LOCK();
            (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_d8,2,0x10);
            }
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < local_84);
      }
      if (!testing) {
        QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine_const&>
                  ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this_00,(this_00->lines).d.size,
                   &local_b8);
        QList<QToolBarAreaLayoutLine>::end(&this_00->lines);
      }
      if (&(local_b8.toolBarItems.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_b8.toolBarItems.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_b8.toolBarItems.d.d)->super_QArrayData,0x18,0x10);
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_7c);
  }
  bVar8 = stream[0x13] == (QDataStream)0x0;
LAB_004baf2c:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QToolBarAreaLayout::restoreState(QDataStream &stream, const QList<QToolBar*> &_toolBars, uchar tmarker, bool testing)
{
    QList<QToolBar*> toolBars = _toolBars;
    int lines;
    stream >> lines;

    for (int j = 0; j < lines; ++j) {
        int pos;
        stream >> pos;
        if (pos < 0 || pos >= QInternal::DockCount)
            return false;
        int cnt;
        stream >> cnt;

        QToolBarAreaLayoutInfo &dock = docks[pos];
        const bool applyingLayout = !testing;
        QToolBarAreaLayoutLine line(dock.o);

        for (int k = 0; k < cnt; ++k) {
            QToolBarAreaLayoutItem item;

            QString objectName;
            stream >> objectName;
            uchar shown;
            stream >> shown;
            item.pos = getInt(stream);
            item.size = getInt(stream);

            /*
               4.3.0 added floating toolbars, but failed to add the ability to restore them.
               We need to store there geometry (four ints). We cannot change the format in a
               patch release (4.3.1) by adding ToolBarStateMarkerEx2 to signal extra data. So
               for now we'll pack it in the two legacy ints we no longer used in Qt4.3.0.
               In 4.4, we should add ToolBarStateMarkerEx2 and fix this properly.
            */

            QRect rect;
            bool floating = false;
            uint geom0, geom1;
            geom0 = getInt(stream);
            if (tmarker == ToolBarStateMarkerEx) {
                geom1 = getInt(stream);
                rect = unpackRect(geom0, geom1, &floating);
            }

            QToolBar *toolBar = nullptr;
            for (int x = 0; x < toolBars.size(); ++x) {
                if (toolBars.at(x)->objectName() == objectName) {
                    toolBar = toolBars.takeAt(x);
                    break;
                }
            }
            if (toolBar == nullptr) {
                continue;
            }

            if (applyingLayout) {
                // Clear the previous widgetItem for the toolBar, so that it's
                // assigned correctly in QWidgetItemV2 constructor.
                auto *toolBarPrivate = QWidgetPrivate::get(toolBar);
                toolBarPrivate->widgetItem = nullptr;
                item.widgetItem = new QWidgetItemV2(toolBar);
                toolBar->setOrientation(floating ? ((shown & 2) ? Qt::Vertical : Qt::Horizontal) : dock.o);
                toolBar->setVisible(shown & 1);
                toolBar->d_func()->setWindowState(floating, false, rect);

                item.preferredSize = item.size;
                line.toolBarItems.append(item);
            }
        }

        if (applyingLayout) {
            dock.lines.append(line);
        }
    }


    return stream.status() == QDataStream::Ok;
}